

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eglwLibrary.cpp
# Opt level: O0

GenericFuncType __thiscall eglw::anon_unknown_0::CoreLoader::get(CoreLoader *this,char *name)

{
  int iVar1;
  undefined4 extraout_var;
  deFunctionPtr local_20;
  GenericFuncType res;
  char *name_local;
  CoreLoader *this_local;
  
  iVar1 = (*this->m_staticLib->_vptr_FunctionLibrary[2])(this->m_staticLib,name);
  local_20 = (deFunctionPtr)CONCAT44(extraout_var,iVar1);
  if ((local_20 == (deFunctionPtr)0x0) && (this->m_dynLib != (DynamicLibrary *)0x0)) {
    local_20 = de::DynamicLibrary::getFunction(this->m_dynLib,name);
  }
  if ((local_20 == (deFunctionPtr)0x0) && (this->m_getProcAddress != (eglGetProcAddressFunc)0x0)) {
    local_20 = (*this->m_getProcAddress)(name);
  }
  return local_20;
}

Assistant:

GenericFuncType get (const char* name) const
	{
		GenericFuncType res = (GenericFuncType)DE_NULL;

		res = (GenericFuncType)m_staticLib->getFunction(name);

		if (!res && m_dynLib)
			res = (GenericFuncType)m_dynLib->getFunction(name);

		if (!res && m_getProcAddress)
			res = (GenericFuncType)m_getProcAddress(name);

		return res;
	}